

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool ignore_tval(wchar_t tval)

{
  ulong local_18;
  size_t i;
  wchar_t tval_local;
  
  local_18 = 0;
  while( true ) {
    if (0x10 < local_18) {
      return false;
    }
    if ((kb_info[tval].num_svals != 0) && (tval == sval_dependent[local_18].tval)) break;
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

bool ignore_tval(int tval)
{
	size_t i;

	/* Only ignore if the tval's allowed */
	for (i = 0; i < N_ELEMENTS(sval_dependent); i++) {
		if (kb_info[tval].num_svals == 0) continue;
		if (tval == sval_dependent[i].tval)
			return true;
	}

	return false;
}